

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdInitializeConfidentialTx(void *handle,uint32_t version,uint32_t locktime,char **tx_string)

{
  string *message;
  char *pcVar1;
  undefined8 *in_RCX;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionController ctxc;
  AbstractTransactionController *in_stack_fffffffffffffee8;
  ConfidentialTransactionController *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  ConfidentialTransactionController *in_stack_ffffffffffffff00;
  allocator *paVar2;
  CfdException *in_stack_ffffffffffffff10;
  string local_e0 [48];
  string *in_stack_ffffffffffffff50;
  allocator local_69;
  string local_68 [32];
  CfdSourceLocation local_48;
  undefined8 *local_20;
  int local_4;
  
  local_20 = in_RCX;
  cfd::Initialize();
  if (local_20 == (undefined8 *)0x0) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0xb1;
    local_48.funcname = "CfdInitializeConfidentialTx";
    cfd::core::logger::warn<>(&local_48,"tx output is null.");
    message = (string *)__cxa_allocate_exception(0x30);
    paVar2 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Failed to parameter. tx output is null.",paVar2);
    cfd::core::CfdException::CfdException
              (in_stack_ffffffffffffff10,(CfdError)((ulong)paVar2 >> 0x20),message);
    __cxa_throw(message,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (in_stack_ffffffffffffff00,(uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffef8);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_(in_stack_fffffffffffffee8);
  pcVar1 = cfd::capi::CreateString(in_stack_ffffffffffffff50);
  *local_20 = pcVar1;
  std::__cxx11::string::~string(local_e0);
  local_4 = 0;
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            (in_stack_fffffffffffffef0);
  return local_4;
}

Assistant:

int CfdInitializeConfidentialTx(
    void* handle, uint32_t version, uint32_t locktime, char** tx_string) {
  try {
    cfd::Initialize();
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    ConfidentialTransactionController ctxc(version, locktime);
    *tx_string = CreateString(ctxc.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}